

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

Index wasm::Bits::getEffectiveShifts(Expression *expr)

{
  uintptr_t uVar1;
  Index IVar2;
  Const *pCVar3;
  int64_t iVar4;
  Type type;
  
  pCVar3 = Expression::cast<wasm::Const>(expr);
  uVar1 = (pCVar3->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
  if (uVar1 == 3) {
    iVar4 = Literal::geti64(&pCVar3->value);
    type.id = 3;
    IVar2 = (Index)iVar4;
  }
  else {
    if (uVar1 != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x4a);
    }
    IVar2 = Literal::geti32(&pCVar3->value);
    type.id = 2;
  }
  IVar2 = getEffectiveShifts(IVar2,type);
  return IVar2;
}

Assistant:

inline Index getEffectiveShifts(Expression* expr) {
  auto* amount = expr->cast<Const>();
  if (amount->type == Type::i32) {
    return getEffectiveShifts(amount->value.geti32(), Type::i32);
  } else if (amount->type == Type::i64) {
    return getEffectiveShifts(amount->value.geti64(), Type::i64);
  }
  WASM_UNREACHABLE("unexpected type");
}